

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O1

void Output(UINT32 CharC,UINT32 Pos)

{
  bool bVar1;
  UINT8 *pUVar2;
  UINT32 UVar3;
  ulong uVar4;
  uint uVar5;
  
  bVar1 = mOutputMask < 2;
  mOutputMask = mOutputMask >> 1;
  if (bVar1) {
    mOutputMask = 0x80;
    if (mBufSiz - 0x28 <= mOutputPos) {
      SendBlock();
      mOutputPos = 0;
    }
    uVar4 = (ulong)mOutputPos;
    Output::CPos = mOutputPos;
    mOutputPos = mOutputPos + 1;
    mBuf[uVar4] = '\0';
  }
  UVar3 = mOutputPos;
  pUVar2 = mBuf;
  uVar4 = (ulong)mOutputPos;
  uVar5 = mOutputPos + 1;
  mOutputPos = uVar5;
  mBuf[uVar4] = (UINT8)CharC;
  mCFreq[CharC] = mCFreq[CharC] + 1;
  if (0xff < CharC) {
    pUVar2[Output::CPos] = pUVar2[Output::CPos] | (byte)mOutputMask;
    pUVar2[uVar5] = '\0';
    pUVar2[UVar3 + 2] = (UINT8)(Pos >> 0x10);
    pUVar2[UVar3 + 3] = (UINT8)(Pos >> 8);
    mOutputPos = UVar3 + 5;
    pUVar2[UVar3 + 4] = (UINT8)Pos;
    uVar5 = 0x1f;
    if (Pos != 0) {
      for (; Pos >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar4 = (ulong)((uVar5 ^ 0xffffffe0) + 0x21);
    if (Pos == 0) {
      uVar4 = (ulong)Pos;
    }
    mPFreq[uVar4] = mPFreq[uVar4] + 1;
  }
  return;
}

Assistant:

STATIC
  VOID
  Output (
  UINT32 CharC,
  UINT32 Pos
  )
  /*++

  Routine Description:

  Outputs an Original Character or a Pointer

  Arguments:

  CharC     - The original character or the 'String Length' element of a Pointer
  Pos     - The 'Position' field of a Pointer

  Returns: (VOID)

  --*/
{
  STATIC UINT32 CPos;

  if ((mOutputMask >>= 1) == 0) {
    mOutputMask = 1U << (UINT8_BIT - 1);
    //
    // Check the buffer overflow per outputting UINT8_BIT symbols
    // which is an Original Character or a Pointer. The biggest
    // symbol is a Pointer which occupies 5 bytes.
    //
    if (mOutputPos >= mBufSiz - 5 * UINT8_BIT) {
      SendBlock ();
      mOutputPos = 0;
    }

    CPos        = mOutputPos++;
    mBuf[CPos]  = 0;
  }

  mBuf[mOutputPos++] = (UINT8) CharC;
  mCFreq[CharC]++;
  if (CharC >= (1U << UINT8_BIT)) {
    mBuf[CPos] |= mOutputMask;
    mBuf[mOutputPos++]  = (UINT8) (Pos >> 24);
    mBuf[mOutputPos++]  = (UINT8) (Pos >> 16);
    mBuf[mOutputPos++]  = (UINT8) (Pos >> (UINT8_BIT));
    mBuf[mOutputPos++]  = (UINT8) Pos;
    CharC               = 0;
    while (Pos) {
      Pos >>= 1;
      CharC++;
    }

    mPFreq[CharC]++;
  }
}